

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  xpath_value_type xVar2;
  xml_attribute_struct *pxVar3;
  xpath_node *pxVar4;
  type_t tVar5;
  xml_node_struct *pxVar6;
  bool once;
  xpath_variable *pxVar7;
  xpath_allocator_capture cr;
  xpath_stack swapped_stack;
  xpath_node_set_raw rs;
  xpath_allocator_capture local_78;
  xpath_stack local_58;
  xpath_node_set_raw local_48;
  
  cVar1 = this->_type;
  switch(cVar1) {
  case '\x0f':
    local_78._target = stack->temp;
    local_78._state._root = (local_78._target)->_root;
    local_78._state._root_size = (local_78._target)->_root_size;
    local_78._state._error = (local_78._target)->_error;
    local_58.temp = stack->result;
    local_58.result = local_78._target;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_48,this->_right,c,&local_58,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_48._begin,local_48._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture(&local_78);
    break;
  case '\x10':
  case '\x12':
  case '\x13':
  case '\x15':
  case '\x16':
  case '\x17':
switchD_001275f2_caseD_10:
    __assert_fail("false && \"Wrong expression for return type node set\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2ad8,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  case '\x11':
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    if (this->_test != '\x01') {
      tVar5 = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,
                         __return_storage_ptr__->_type,false);
      __return_storage_ptr__->_type = tVar5;
    }
    once = eval == nodeset_eval_any;
    if (__return_storage_ptr__->_type == type_sorted) {
      once = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,once);
    break;
  case '\x14':
    xVar2 = ((this->_data).variable)->_type;
    if (xVar2 != (byte)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2ac7,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (this->_rettype != 1) goto switchD_001275f2_caseD_10;
    pxVar7 = (xpath_variable *)&(anonymous_namespace)::dummy_node_set;
    if (xVar2 == xpath_type_node_set) {
      pxVar7 = (this->_data).variable + 1;
    }
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_type = pxVar7->_type;
    xpath_node_set_raw::append
              (__return_storage_ptr__,(xpath_node *)pxVar7[1]._next,*(xpath_node **)(pxVar7 + 2),
               stack->result);
    break;
  case '\x18':
switchD_001275f2_caseD_18:
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    break;
  default:
    if (cVar1 != '8') {
      if (cVar1 != '9') goto switchD_001275f2_caseD_10;
      if (this->_right != (xpath_ast_node *)0x0) {
        __assert_fail("!_right",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2ab9,
                      "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                     );
      }
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      pxVar6 = (c->n)._node._root;
      pxVar3 = (c->n)._attribute._attr;
      if (pxVar6 == (xml_node_struct *)0x0 || pxVar3 != (xml_attribute_struct *)0x0) {
        if (pxVar3 == (xml_attribute_struct *)0x0) {
          return __return_storage_ptr__;
        }
        pxVar6 = (c->n)._node._root;
        if (pxVar6 == (xml_node_struct *)0x0) {
          local_78._target = (xpath_allocator *)0x0;
          goto LAB_001276f5;
        }
      }
      local_78._target =
           (xpath_allocator *)(*(long *)((long)pxVar6 - (pxVar6->header >> 8)) + -0x40);
LAB_001276f5:
      local_78._state._root = (xpath_memory_block *)0x0;
      pxVar4 = __return_storage_ptr__->_end;
      if (pxVar4 != __return_storage_ptr__->_eos) {
        __return_storage_ptr__->_end = pxVar4 + 1;
        (pxVar4->_node)._root = (xml_node_struct *)local_78._target;
        (pxVar4->_attribute)._attr = (xml_attribute_struct *)0x0;
        return __return_storage_ptr__;
      }
      xpath_node_set_raw::push_back_grow
                (__return_storage_ptr__,(xpath_node *)&local_78,stack->result);
      return __return_storage_ptr__;
    }
    switch(this->_axis) {
    case '\0':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x01':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x02':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x03':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x04':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x05':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x06':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\a':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\b':
      goto switchD_001275f2_caseD_18;
    case '\t':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\n':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\v':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\f':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    default:
      __assert_fail("false && \"Unknown axis\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2ab2,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}